

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_buffer_stream.h
# Opt level: O0

int __thiscall crnlib::buffer_stream::close(buffer_stream *this,int __fd)

{
  buffer_stream *pbVar1;
  bool bVar2;
  buffer_stream *this_local;
  
  pbVar1 = (buffer_stream *)
           (CONCAT71((int7)((ulong)this >> 8),(this->super_data_stream).field_0x1a) &
           0xffffffffffffff01);
  bVar2 = (char)pbVar1 != '\0';
  if (bVar2) {
    (this->super_data_stream).field_0x1a = (this->super_data_stream).field_0x1a & 0xfe;
    this->m_pBuf = (uint8 *)0x0;
    this->m_size = 0;
    this->m_ofs = 0;
    pbVar1 = this;
  }
  return (int)CONCAT71((int7)((ulong)pbVar1 >> 8),bVar2);
}

Assistant:

virtual bool close()
        {
            if (m_opened)
            {
                m_opened = false;
                m_pBuf = nullptr;
                m_size = 0;
                m_ofs = 0;
                return true;
            }

            return false;
        }